

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

uint32 __thiscall
Clasp::Solver::finalizeConflictClause(Solver *this,LitVec *cc,ConstraintInfo *info,uint32 ccRepMode)

{
  uint *puVar1;
  uint32 uVar2;
  Literal p;
  pointer pDVar3;
  pointer puVar4;
  pointer pLVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  size_type sVar9;
  pointer pLVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  pointer pLVar16;
  byte bVar17;
  ulong uVar18;
  ulong uVar19;
  pointer pLVar20;
  bool bVar21;
  uint local_64;
  Literal local_4c;
  ulong local_48;
  ConstraintInfo *local_40;
  Literal local_34;
  
  uVar11 = ((cc->ebo_).buf)->rep_ >> 2;
  uVar6 = (this->tag_).rep_;
  if ((cc->ebo_).size == 1) {
    bVar17 = 0;
    uVar8 = 1;
    uVar18 = 0;
    local_64 = 1;
  }
  else {
    iVar12 = 0;
    local_64 = 1;
    uVar18 = 0;
    uVar8 = 1;
    bVar17 = 0;
    uVar7 = 1;
    do {
      pLVar16 = (cc->ebo_).buf;
      uVar13 = pLVar16[uVar7].rep_;
      puVar4 = (this->assign_).assign_.ebo_.buf;
      uVar19 = (ulong)(uVar13 & 0xfffffffc);
      uVar15 = *(uint *)((long)puVar4 + uVar19);
      *(uint *)((long)puVar4 + uVar19) = uVar15 & 0xfffffff3;
      uVar13 = uVar13 >> 2;
      if ((pLVar16[uVar7].rep_ ^ uVar6 ^ 2) < 2) {
        bVar17 = 1;
      }
      if (uVar13 <= uVar11) {
        uVar13 = uVar11;
      }
      uVar11 = uVar13;
      uVar15 = uVar15 >> 4;
      if ((uint)uVar18 < uVar15) {
        uVar18 = (ulong)uVar15;
        uVar8 = uVar7;
      }
      pDVar3 = (this->levels_).super_type.ebo_.buf;
      uVar13 = *(uint *)(pDVar3 + (uVar15 - 1));
      if ((uVar13 >> 0x1e & 1) != 0) {
        *(uint *)(pDVar3 + (uVar15 - 1)) = uVar13 & 0xbfffffff;
        uVar13 = (this->levels_).root;
        bVar21 = iVar12 == 0;
        iVar12 = iVar12 + (uint)(uVar15 <= uVar13);
        local_64 = local_64 + (bVar21 || uVar13 < uVar15);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (cc->ebo_).size);
  }
  if (uVar8 != 1) {
    pLVar16 = (cc->ebo_).buf;
    uVar2 = pLVar16[1].rep_;
    pLVar16[1].rep_ = pLVar16[uVar8].rep_;
    pLVar16[uVar8].rep_ = uVar2;
  }
  if (ccRepMode == 3) {
    ccRepMode = ((double)local_64 / (double)(this->levels_).super_type.ebo_.size <= 0.66) + 1;
  }
  local_40 = info;
  if (ccRepMode != 0) {
    pLVar16 = (cc->ebo_).buf;
    uVar11 = pLVar16->rep_ >> 2;
    if (ccRepMode == 1) {
      local_64 = (int)uVar18 + 1;
      local_34.rep_ = 0;
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::resize
                (cc,local_64,&local_34);
      if ((int)uVar18 == 0) {
        local_64 = 1;
        bVar17 = 0;
      }
      else {
        pLVar16 = (this->assign_).trail.ebo_.buf;
        pDVar3 = (this->levels_).super_type.ebo_.buf;
        pLVar20 = (cc->ebo_).buf;
        lVar14 = uVar18 << 2;
        bVar17 = 0;
        do {
          pLVar20 = pLVar20 + 1;
          uVar8 = *(uint *)((long)&pLVar16->rep_ +
                           (ulong)(uint)(*(int *)(&pDVar3[-1].field_0x0 + lVar14 * 4) << 2));
          if ((uVar8 ^ uVar6) < 2) {
            bVar17 = 1;
          }
          uVar7 = uVar8 >> 2;
          if (uVar8 >> 2 <= uVar11) {
            uVar7 = uVar11;
          }
          uVar11 = uVar7;
          pLVar20->rep_ = uVar8 & 0xfffffffe ^ 2;
          lVar14 = lVar14 + -4;
        } while (lVar14 != 0);
      }
    }
    else {
      uVar8 = (cc->ebo_).size;
      iVar12 = uVar8 - 1;
      if (1 < uVar8) {
        puVar4 = (this->assign_).assign_.ebo_.buf;
        do {
          uVar8 = pLVar16[uVar8 - 1].rep_;
          puVar1 = (uint *)((long)puVar4 + (ulong)(uVar8 & 0xfffffffc));
          *puVar1 = *puVar1 | (uint)((uVar8 & 2) == 0) * 4 + 4;
          uVar8 = (cc->ebo_).size - 1;
          (cc->ebo_).size = uVar8;
        } while (1 < uVar8);
      }
      local_48 = uVar18;
      if (iVar12 == 0) {
        bVar17 = 0;
      }
      else {
        pLVar20 = (this->assign_).trail.ebo_.buf + (this->assign_).trail.ebo_.size;
        pLVar16 = (pointer)(ulong)(uVar6 >> 2);
        bVar17 = 0;
        uVar8 = uVar11;
        do {
          puVar4 = (this->assign_).assign_.ebo_.buf;
          pLVar5 = pLVar20 + -2;
          do {
            pLVar10 = pLVar5;
            uVar7 = pLVar20[-1].rep_;
            pLVar20 = pLVar20 + -1;
            uVar13 = *(uint *)((long)puVar4 + (ulong)(uVar7 & 0xfffffffc));
            pLVar5 = pLVar10 + -1;
          } while (((uVar7 & 2) * 2 + 4 & uVar13) == 0);
          iVar12 = iVar12 + -1;
          if (iVar12 == 0) {
            bVar21 = false;
          }
          else {
            bVar21 = (this->assign_).reason_.super_type.ebo_.buf[uVar7 >> 2].data_ != 0;
          }
          puVar4[uVar7 >> 2] = uVar13 & 0xfffffff3;
          if (bVar21) {
            do {
              pLVar16 = pLVar10;
              if (pLVar16 + 1 ==
                  (pointer)((long)&((this->assign_).trail.ebo_.buf)->rep_ +
                           (ulong)(uint)(*(int *)((this->levels_).super_type.ebo_.buf +
                                                 ((*(uint *)((long)puVar4 +
                                                            (ulong)(pLVar20->rep_ & 0xfffffffc)) >>
                                                  4) - 1)) << 2))) break;
              pLVar10 = pLVar16 + -1;
            } while ((*(uint *)((long)puVar4 + (ulong)(pLVar16->rep_ & 0xfffffffc)) &
                     (pLVar16->rep_ & 2) * 2 + 4) == 0);
          }
          if ((bVar21) &&
             (p.rep_ = pLVar20->rep_,
             (*(uint *)((long)puVar4 + (ulong)(p.rep_ & 0xfffffffc)) ^
             *(uint *)((long)puVar4 + (ulong)(pLVar16->rep_ & 0xfffffffc))) < 0x10)) {
            (this->conflict_).ebo_.size = 0;
            Antecedent::reason((this->assign_).reason_.super_type.ebo_.buf + (p.rep_ >> 2),this,p,
                               &this->conflict_);
            sVar9 = (this->conflict_).ebo_.size;
            if (sVar9 != 0) {
              puVar4 = (this->assign_).assign_.ebo_.buf;
              pLVar5 = (this->conflict_).ebo_.buf;
              do {
                uVar13 = pLVar5[sVar9 - 1].rep_;
                uVar15 = *(uint *)((long)puVar4 + (ulong)(uVar13 & 0xfffffffc));
                uVar7 = (uVar13 & 2) * 2 + 4;
                if ((uVar7 & uVar15) == 0) {
                  iVar12 = iVar12 + 1;
                  puVar4[uVar13 >> 2] = uVar7 | uVar15;
                }
                sVar9 = (this->conflict_).ebo_.size - 1;
                (this->conflict_).ebo_.size = sVar9;
              } while (sVar9 != 0);
            }
          }
          else {
            local_4c.rep_ = pLVar20->rep_ & 0xfffffffe ^ 2;
            bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                      (cc,&local_4c);
            uVar7 = pLVar20->rep_ >> 2;
            if (uVar7 == uVar6 >> 2) {
              bVar17 = 1;
            }
            bVar21 = uVar11 < uVar7;
            uVar11 = uVar8;
            if (bVar21) {
              uVar11 = uVar7;
              uVar8 = uVar7;
            }
          }
        } while (iVar12 != 0);
      }
      local_64 = (cc->ebo_).size;
      uVar18 = local_48;
    }
  }
  uVar6 = 0x7f;
  if (local_64 < 0x7f) {
    uVar6 = local_64;
  }
  uVar7 = uVar6 << 0x14 | (this->ccInfo_).super_ConstraintScore.rep & 0xfffff;
  uVar6 = (local_40->super_ConstraintScore).rep;
  uVar13 = uVar6 & 0xf0000000;
  uVar8 = uVar13 + uVar7 + 0x80000000;
  if (!(bool)((int)uVar6 < 0 ^ bVar17)) {
    uVar8 = uVar13 | uVar7;
  }
  (local_40->super_ConstraintScore).rep = uVar8;
  if ((this->shared_->varInfo_).ebo_.size - 1 < uVar11 != (bool)((byte)(uVar8 >> 0x1e) & 1)) {
    (local_40->super_ConstraintScore).rep = uVar8 ^ 0x40000000;
  }
  return (uint32)uVar18;
}

Assistant:

uint32 Solver::finalizeConflictClause(LitVec& cc, ConstraintInfo& info, uint32 ccRepMode) {
	// 2. clear flags and compute lbd
	uint32  lbd         = 1;
	uint32  onRoot      = 0;
	uint32  varLevel    = 0;
	uint32  assertLevel = 0;
	uint32  assertPos   = 1;
	uint32  maxVar      = cc[0].var();
	Literal tagLit      = ~tagLiteral();
	bool    tagged      = false;
	for (LitVec::size_type i = 1; i != cc.size(); ++i) {
		Var v = cc[i].var();
		clearSeen(v);
		if (cc[i] == tagLit) { tagged = true; }
		if (v > maxVar)      { maxVar = v;    }
		if ( (varLevel = level(v)) > assertLevel ) {
			assertLevel = varLevel;
			assertPos   = static_cast<uint32>(i);
		}
		if (hasLevel(varLevel)) {
			unmarkLevel(varLevel);
			lbd += (varLevel > rootLevel()) || (++onRoot == 1);
		}
	}
	if (assertPos != 1) { std::swap(cc[1], cc[assertPos]); }
	if (ccRepMode == SolverStrategies::cc_rep_dynamic) {
		ccRepMode = double(lbd)/double(decisionLevel()) > .66 ? SolverStrategies::cc_rep_decision : SolverStrategies::cc_rep_uip;
	}
	if (ccRepMode) {
		maxVar = cc[0].var(), tagged = false, lbd = 1;
		if (ccRepMode == SolverStrategies::cc_rep_decision) {
			// replace cc with decision sequence
			cc.resize(assertLevel+1);
			for (uint32 i = assertLevel; i;){
				Literal x = ~decision(i--);
				cc[lbd++] = x;
				if (x == tagLit)     { tagged = true; }
				if (x.var() > maxVar){ maxVar = x.var(); }
			}
		}
		else {
			// replace cc with all uip clause
			uint32 marked = sizeVec(cc) - 1;
			while (cc.size() > 1) { markSeen(~cc.back()); cc.pop_back(); }
			for (LitVec::const_iterator tr = assign_.trail.end(), next, stop; marked;) {
				while (!seen(*--tr)) { ; }
				bool n = --marked != 0 && !reason(*tr).isNull();
				clearSeen(tr->var());
				if (n) { for (next = tr, stop = assign_.trail.begin() + levelStart(level(tr->var())); next-- != stop && !seen(*next);) { ; } }
				if (!n || level(next->var()) != level(tr->var())) {
					cc.push_back(~*tr);
					if (tr->var() == tagLit.var()){ tagged = true; }
					if (tr->var() > maxVar)       { maxVar = tr->var(); }
				}
				else {
					for (reason(*tr, conflict_); !conflict_.empty(); conflict_.pop_back()) {
						if (!seen(conflict_.back())) { ++marked; markSeen(conflict_.back()); }
					}
				}
			}
			lbd = sizeVec(cc);
		}
	}
	info.setScore(makeScore(ccInfo_.activity(), lbd));
	info.setTagged(tagged);
	info.setAux(auxVar(maxVar));
	return assertLevel;
}